

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O2

void __thiscall DSBarInfo::ShowPop(DSBarInfo *this,int popnum)

{
  SBarInfo *pSVar1;
  bool bVar2;
  int iVar3;
  
  DBaseStatusBar::ShowPop(&this->super_DBaseStatusBar,popnum);
  iVar3 = this->currentPopup;
  bVar2 = false;
  if (iVar3 == popnum) {
    popnum = 0;
  }
  this->pendingPopup = popnum;
  if (iVar3 == 0) {
    this->currentPopup = popnum;
    this->pendingPopup = 0;
    bVar2 = true;
    iVar3 = popnum;
    if (popnum == 0) {
      return;
    }
  }
  pSVar1 = this->script;
  pSVar1->popups[(long)iVar3 + -1].opened = bVar2;
  pSVar1->popups[(long)iVar3 + -1].moving = true;
  return;
}

Assistant:

void ShowPop(int popnum)
	{
		DBaseStatusBar::ShowPop(popnum);
		if(popnum != currentPopup)
		{
			pendingPopup = popnum;
		}
		else
			pendingPopup = POP_None;
		if(currentPopup != POP_None)
			script->popups[currentPopup-1].close();
		else
		{
			currentPopup = pendingPopup;
			pendingPopup = POP_None;
			if(currentPopup != POP_None)
				script->popups[currentPopup-1].open();
		}
	}